

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_tracker_connection.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::udp_tracker_connection::send_udp_scrape(udp_tracker_connection *this)

{
  ushort uVar1;
  iterator iVar2;
  bool bVar3;
  span<const_char> p;
  error_code ec;
  char buf [36];
  span<char> view;
  
  if (this->m_abort == false) {
    bVar3 = (this->m_target).impl_.data_.base.sa_family != 2;
    if (bVar3) {
      buf._8_8_ = *(undefined8 *)((long)&(this->m_target).impl_.data_ + 8);
      buf._16_8_ = *(undefined8 *)((long)&(this->m_target).impl_.data_ + 0x10);
      buf._24_8_ = ZEXT48((this->m_target).impl_.data_.v6.sin6_scope_id);
      buf._4_4_ = 0;
    }
    else {
      buf._4_4_ = (this->m_target).impl_.data_.v4.sin_addr.s_addr;
      buf[8] = '\0';
      buf[9] = '\0';
      buf[10] = '\0';
      buf[0xb] = '\0';
      buf[0xc] = '\0';
      buf[0xd] = '\0';
      buf[0xe] = '\0';
      buf[0xf] = '\0';
      buf[0x10] = '\0';
      buf[0x11] = '\0';
      buf[0x12] = '\0';
      buf[0x13] = '\0';
      buf[0x14] = '\0';
      buf[0x15] = '\0';
      buf[0x16] = '\0';
      buf[0x17] = '\0';
      buf[0x18] = '\0';
      buf[0x19] = '\0';
      buf[0x1a] = '\0';
      buf[0x1b] = '\0';
      buf[0x1c] = '\0';
      buf[0x1d] = '\0';
      buf[0x1e] = '\0';
      buf[0x1f] = '\0';
    }
    buf._0_4_ = ZEXT14(bVar3);
    iVar2 = ::std::
            _Rb_tree<boost::asio::ip::address,_std::pair<const_boost::asio::ip::address,_libtorrent::aux::udp_tracker_connection::connection_cache_entry>,_std::_Select1st<std::pair<const_boost::asio::ip::address,_libtorrent::aux::udp_tracker_connection::connection_cache_entry>_>,_std::less<boost::asio::ip::address>,_std::allocator<std::pair<const_boost::asio::ip::address,_libtorrent::aux::udp_tracker_connection::connection_cache_entry>_>_>
            ::find((_Rb_tree<boost::asio::ip::address,_std::pair<const_boost::asio::ip::address,_libtorrent::aux::udp_tracker_connection::connection_cache_entry>,_std::_Select1st<std::pair<const_boost::asio::ip::address,_libtorrent::aux::udp_tracker_connection::connection_cache_entry>_>,_std::less<boost::asio::ip::address>,_std::allocator<std::pair<const_boost::asio::ip::address,_libtorrent::aux::udp_tracker_connection::connection_cache_entry>_>_>
                    *)m_connection_cache,(key_type *)buf);
    if (iVar2._M_node != (_Base_ptr)(m_connection_cache + 8)) {
      view.m_len = 0x24;
      view.m_ptr = buf;
      write_impl<long,long,char>(*(long *)(iVar2._M_node + 2),&view);
      write_impl<int,libtorrent::aux::udp_tracker_connection::action_t,char>(scrape,&view);
      write_impl<int,unsigned_int,char>(this->m_transaction_id,&view);
      ::std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_char_const*,char*>
                ((uchar *)&(this->super_tracker_connection).m_req.info_hash,
                 (uchar *)&(this->super_tracker_connection).m_req.pid,view.m_ptr);
      ec.val_ = 0;
      ec.failed_ = false;
      ec.cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.
                 super_error_category;
      if ((this->m_hostname)._M_string_length == 0) {
        tracker_manager::send
                  ((this->super_tracker_connection).m_man,(int)this + 0x188,&this->m_target,
                   (size_t)buf,0x24);
      }
      else {
        uVar1 = (this->m_target).impl_.data_.v4.sin_port;
        p.m_len = 0x24;
        p.m_ptr = buf;
        tracker_manager::send_hostname
                  ((this->super_tracker_connection).m_man,
                   &(this->super_tracker_connection).m_req.outgoing_socket,
                   (this->m_hostname)._M_dataplus._M_p,(uint)(ushort)(uVar1 << 8 | uVar1 >> 8),p,&ec
                   ,(udp_send_flags_t)0x2);
      }
      this->m_state = scrape;
      tracker_connection::sent_bytes(&this->super_tracker_connection,0x40);
      this->m_attempts = this->m_attempts + 1;
      if (ec.failed_ == true) {
        fail(this,&ec,sock_write,"",(seconds32)0x0,(seconds32)0x1e);
      }
    }
  }
  return;
}

Assistant:

void udp_tracker_connection::send_udp_scrape()
	{
		if (m_abort) return;

		auto const i = m_connection_cache.find(m_target.address());
		// this isn't really supposed to happen
		TORRENT_ASSERT(i != m_connection_cache.end());
		if (i == m_connection_cache.end()) return;

		char buf[8 + 4 + 4 + 20];
		span<char> view = buf;

		aux::write_int64(i->second.connection_id, view); // connection_id
		aux::write_int32(action_t::scrape, view); // action (scrape)
		aux::write_int32(m_transaction_id, view); // transaction_id
		// info_hash
		std::copy(tracker_req().info_hash.begin(), tracker_req().info_hash.end()
			, view.data());
#if TORRENT_USE_ASSERTS
		TORRENT_ASSERT(view.size() == 20);
#endif

		error_code ec;
		if (!m_hostname.empty())
		{
			m_man.send_hostname(bind_socket(), m_hostname.c_str(), m_target.port()
				, buf, ec, udp_socket::tracker_connection);
		}
		else
		{
			m_man.send(bind_socket(), m_target, buf, ec
				, udp_socket::tracker_connection);
		}
		m_state = action_t::scrape;
		sent_bytes(sizeof(buf) + 28); // assuming UDP/IP header
		++m_attempts;
		if (ec)
		{
			fail(ec, operation_t::sock_write);
			return;
		}
	}